

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxbmhandler.cpp
# Opt level: O0

bool QXbmHandler::canRead(QIODevice *device)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  QIODevice *device_00;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  bool success;
  qint64 oldPos;
  QImage image;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  bool local_51;
  char local_38 [32];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (QMessageLogger *)0x0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcImageIo();
    anon_unknown.dwarf_33edce::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,
                                 CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))),
               in_stack_ffffffffffffff88);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_33edce::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x333c37);
      QMessageLogger::QMessageLogger
                (in_RDI,in_stack_ffffffffffffff98,
                 CONCAT13(in_stack_ffffffffffffff97,
                          CONCAT12(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94)),
                 (char *)in_stack_ffffffffffffff88,(char *)0x333c4d);
      QMessageLogger::warning(local_38,"QXbmHandler::canRead() called with no device");
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_51 = false;
  }
  else {
    uVar3 = (**(code **)(*(long *)&in_RDI->context + 0x60))();
    if ((uVar3 & 1) == 0) {
      QImage::QImage((QImage *)
                     CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,
                                       CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                      )));
      device_00 = (QIODevice *)(**(code **)(*(long *)&in_RDI->context + 0x78))();
      bVar2 = read_xbm_image(device_00,
                             (QImage *)
                             CONCAT17(in_stack_ffffffffffffff97,
                                      CONCAT16(in_stack_ffffffffffffff96,
                                               CONCAT24(in_stack_ffffffffffffff94,
                                                        in_stack_ffffffffffffff90))));
      (**(code **)(*(long *)&in_RDI->context + 0x88))(in_RDI,device_00);
      local_51 = (bool)(bVar2 & 1);
      QImage::~QImage((QImage *)
                      CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff96,
                                              CONCAT24(in_stack_ffffffffffffff94,
                                                       in_stack_ffffffffffffff90))));
    }
    else {
      local_51 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_51;
  }
  __stack_chk_fail();
}

Assistant:

bool QXbmHandler::canRead(QIODevice *device)
{
    if (!device) {
        qCWarning(lcImageIo, "QXbmHandler::canRead() called with no device");
        return false;
    }

    // it's impossible to tell whether we can load an XBM or not when
    // it's from a sequential device, as the only way to do it is to
    // attempt to parse the whole image.
    if (device->isSequential())
        return false;

    QImage image;
    qint64 oldPos = device->pos();
    bool success = read_xbm_image(device, &image);
    device->seek(oldPos);

    return success;
}